

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::MoveRegToMemByRegPlusConst::MoveRegToMemByRegPlusConst
          (MoveRegToMemByRegPlusConst *this,CTemp *target,int constant,CTemp *source)

{
  CTemp *source_local;
  int constant_local;
  CTemp *target_local;
  MoveRegToMemByRegPlusConst *this_local;
  
  AssemblyCommand::AssemblyCommand(&this->super_AssemblyCommand);
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00239f60;
  IRT::CTemp::CTemp(&this->target,target);
  this->constant = constant;
  IRT::CTemp::CTemp(&this->source,source);
  return;
}

Assistant:

AssemblyCode::MoveRegToMemByRegPlusConst::MoveRegToMemByRegPlusConst( const IRT::CTemp &target, int constant,
                                                                      const IRT::CTemp &source ) : target( target ),
                                                                                                   constant( constant ),
                                                                                                   source( source ) { }